

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportBuildFileGenerator::cmExportBuildFileGenerator(cmExportBuildFileGenerator *this)

{
  Snapshot snapshot;
  PositionType local_38;
  Snapshot local_28;
  cmExportBuildFileGenerator *local_10;
  cmExportBuildFileGenerator *this_local;
  
  local_10 = this;
  cmExportFileGenerator::cmExportFileGenerator(&this->super_cmExportFileGenerator);
  (this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator =
       (_func_int **)&PTR__cmExportBuildFileGenerator_00a40be0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Targets);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector(&this->Exports);
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator(&local_38);
  cmState::Snapshot::Snapshot(&local_28,(cmState *)0x0,local_38);
  snapshot.Position.Tree = local_28.Position.Tree;
  snapshot.State = local_28.State;
  snapshot.Position.Position = local_28.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot);
  this->Makefile = (cmMakefile *)0x0;
  this->ExportSet = (cmExportSet *)0x0;
  return;
}

Assistant:

cmExportBuildFileGenerator::cmExportBuildFileGenerator()
  : Backtrace()
{
  this->Makefile = 0;
  this->ExportSet = 0;
}